

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

TokenOrSyntax * __thiscall
slang::syntax::NewArrayExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,NewArrayExpressionSyntax *this,size_t index)

{
  ParenthesizedExpressionSyntax *pPVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  switch(index) {
  case 0:
    pPVar1 = (ParenthesizedExpressionSyntax *)(this->newKeyword).ptr;
    break;
  case 1:
    uVar2._0_2_ = (this->openBracket).kind;
    uVar2._2_1_ = (this->openBracket).field_0x2;
    uVar2._3_1_ = (this->openBracket).numFlags;
    uVar3 = (this->openBracket).rawLen;
    uVar4 = *(undefined4 *)&(this->openBracket).info;
    uVar5 = *(undefined4 *)((long)&(this->openBracket).info + 4);
    goto LAB_002dddf9;
  case 2:
    pPVar1 = (ParenthesizedExpressionSyntax *)(this->sizeExpr).ptr;
    break;
  case 3:
    uVar2._0_2_ = (this->closeBracket).kind;
    uVar2._2_1_ = (this->closeBracket).field_0x2;
    uVar2._3_1_ = (this->closeBracket).numFlags;
    uVar3 = (this->closeBracket).rawLen;
    uVar4 = *(undefined4 *)&(this->closeBracket).info;
    uVar5 = *(undefined4 *)((long)&(this->closeBracket).info + 4);
LAB_002dddf9:
    *(undefined4 *)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar2;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
         uVar3;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
         uVar4;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc)
         = uVar5;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\0';
    return __return_storage_ptr__;
  case 4:
    pPVar1 = this->initializer;
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
    return __return_storage_ptr__;
  }
  *(ParenthesizedExpressionSyntax **)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pPVar1;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax NewArrayExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return newKeyword.get();
        case 1: return openBracket;
        case 2: return sizeExpr.get();
        case 3: return closeBracket;
        case 4: return initializer;
        default: return nullptr;
    }
}